

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept_mdapi.cpp
# Opt level: O0

void __thiscall CLIntercept::initCustomPerfCounters(CLIntercept *this)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  SConfig *pSVar3;
  ulong uVar4;
  string *psVar5;
  CLIntercept *in_RDI;
  double __x;
  double dVar6;
  string fileName;
  uint32_t bufferSizeBytes;
  uint32_t timerNS;
  string permissionString;
  bool includeMaxValues;
  uint32_t adapterIndex;
  string *metricsFileName;
  string *metricSetSymbolName;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  Services_Common *this_00;
  string *in_stack_fffffffffffffe78;
  allocator *paVar7;
  string *in_stack_fffffffffffffe80;
  allocator *subDir;
  MDHelper *in_stack_fffffffffffffe90;
  MDHelper *in_stack_fffffffffffffea0;
  uint32_t pid;
  SConfig *in_stack_fffffffffffffea8;
  SConfig *in_stack_fffffffffffffeb0;
  MDHelper *in_stack_fffffffffffffeb8;
  SConfig *in_stack_fffffffffffffec0;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  undefined4 in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  undefined1 local_99 [40];
  allocator local_71;
  string local_70 [32];
  int local_50 [4];
  string local_40 [35];
  byte local_1d;
  uint32_t local_1c;
  string *local_18;
  string *local_10;
  
  pSVar3 = config(in_RDI);
  local_10 = (string *)&pSVar3->DevicePerfCounterCustom;
  pSVar3 = config(in_RDI);
  local_18 = &pSVar3->DevicePerfCounterFile;
  pSVar3 = config(in_RDI);
  local_1c = pSVar3->DevicePerfCounterAdapterIndex;
  pSVar3 = config(in_RDI);
  pid = (uint32_t)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  local_1d = pSVar3->DevicePerfCounterReportMax & 1;
  if (in_RDI->m_pMDHelper == (MDHelper *)0x0) {
    std::__cxx11::string::string(local_40);
    OS(in_RDI);
    bVar1 = ::OS::Services::CheckMDAPIPermissions
                      ((Services *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    if (!bVar1) {
      log(in_RDI,__x);
    }
    pSVar3 = config(in_RDI);
    pid = (uint32_t)((ulong)in_stack_fffffffffffffea0 >> 0x20);
    if ((pSVar3->DevicePerfCounterEventBasedSampling & 1U) == 0) {
      in_stack_fffffffffffffeb0 = config(in_RDI);
      if ((in_stack_fffffffffffffeb0->DevicePerfCounterTimeBasedSampling & 1U) == 0) {
        local_50[0] = 0;
        std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_50);
      }
      else {
        in_stack_fffffffffffffea8 = config(in_RDI);
        in_stack_fffffffffffffea0 =
             MetricsDiscovery::MDHelper::CreateTBS
                       (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                        in_stack_fffffffffffffe70,
                        (uint32_t)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                        SUB81((ulong)in_stack_fffffffffffffe68 >> 0x18,0));
        in_RDI->m_pMDHelper = in_stack_fffffffffffffea0;
      }
      pid = (uint32_t)((ulong)in_stack_fffffffffffffea0 >> 0x20);
    }
    else {
      in_stack_fffffffffffffec0 = config(in_RDI);
      in_stack_fffffffffffffeb8 =
           MetricsDiscovery::MDHelper::CreateEBS
                     (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                      (uint32_t)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                      SUB81((ulong)in_stack_fffffffffffffe68 >> 0x18,0));
      in_RDI->m_pMDHelper = in_stack_fffffffffffffeb8;
    }
    if (in_RDI->m_pMDHelper == (MDHelper *)0x0) {
      in_stack_fffffffffffffe90 = (MDHelper *)local_99;
      std::allocator<char>::allocator();
      dVar6 = (double)std::__cxx11::string::string
                                ((string *)(local_99 + 1),"Metric Discovery failed to initialize.\n"
                                 ,(allocator *)in_stack_fffffffffffffe90);
      log(in_RDI,dVar6);
      std::__cxx11::string::~string((string *)(local_99 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_99);
    }
    else {
      std::allocator<char>::allocator();
      dVar6 = (double)std::__cxx11::string::string
                                (local_70,"Metric Discovery initialized.\n",&local_71);
      log(in_RDI,dVar6);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    std::__cxx11::string::~string(local_40);
  }
  if (in_RDI->m_pMDHelper != (MDHelper *)0x0) {
    pSVar3 = config(in_RDI);
    if ((pSVar3->DevicePerfCounterTimeBasedSampling & 1U) != 0) {
      config(in_RDI);
      pSVar3 = config(in_RDI);
      in_stack_ffffffffffffff5c = pSVar3->DevicePerfCounterTimeBasedBufferSize;
      MetricsDiscovery::MDHelper::OpenStream
                ((MDHelper *)in_stack_fffffffffffffeb0,
                 (uint32_t)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffea8,pid);
    }
    uVar4 = std::ofstream::is_open();
    if ((uVar4 & 1) == 0) {
      subDir = &local_c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"",subDir);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      psVar5 = (string *)OS(in_RDI);
      paVar7 = &local_f1;
      this_00 = (Services_Common *)sc_DumpDirectoryName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,(char *)this_00,paVar7);
      ::OS::Services_Common::GetDumpDirectoryName
                ((Services_Common *)in_stack_fffffffffffffe90,(string *)subDir,psVar5);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      std::__cxx11::string::operator+=(local_c8,'/');
      std::__cxx11::string::operator+=(local_c8,sc_PerfCountersFileNamePrefix);
      std::__cxx11::string::operator+=(local_c8,"_");
      std::__cxx11::string::operator+=(local_c8,local_10);
      std::__cxx11::string::operator+=(local_c8,".csv");
      psVar5 = (string *)OS(in_RDI);
      ::OS::Services_Common::MakeDumpDirectories(this_00,psVar5);
      if (((in_RDI->m_Config).UniqueFiles & 1U) != 0) {
        Utils::GetUniqueFileName
                  ((string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        std::__cxx11::string::operator=(local_c8,local_118);
        std::__cxx11::string::~string(local_118);
      }
      _Var2 = std::__cxx11::string::c_str();
      std::operator|(_S_out,_S_bin);
      std::ofstream::open((char *)&in_RDI->m_MetricDump,_Var2);
      MetricsDiscovery::MDHelper::PrintMetricNames(in_stack_fffffffffffffe90,(ostream *)subDir);
      MetricsDiscovery::MDHelper::PrintMetricUnits
                ((MDHelper *)in_stack_fffffffffffffec0,(ostream *)in_stack_fffffffffffffeb8);
      std::__cxx11::string::~string(local_c8);
    }
  }
  return;
}

Assistant:

void CLIntercept::initCustomPerfCounters()
{
    const std::string& metricSetSymbolName = config().DevicePerfCounterCustom;
    const std::string& metricsFileName = config().DevicePerfCounterFile;
    uint32_t adapterIndex = config().DevicePerfCounterAdapterIndex;
    bool includeMaxValues = config().DevicePerfCounterReportMax;

    if( m_pMDHelper == NULL )
    {
        std::string permissionString;
        if( OS().CheckMDAPIPermissions(permissionString) == false )
        {
            log( permissionString );
        }

        if( config().DevicePerfCounterEventBasedSampling )
        {
            m_pMDHelper = MetricsDiscovery::MDHelper::CreateEBS(
                config().DevicePerfCounterLibName,
                metricSetSymbolName,
                metricsFileName,
                adapterIndex,
                includeMaxValues );
        }
        else if( config().DevicePerfCounterTimeBasedSampling )
        {
            m_pMDHelper = MetricsDiscovery::MDHelper::CreateTBS(
                config().DevicePerfCounterLibName,
                metricSetSymbolName,
                metricsFileName,
                adapterIndex,
                includeMaxValues );
        }
        else
        {
            CLI_ASSERT( 0 );
        }
        if( m_pMDHelper )
        {
            log( "Metric Discovery initialized.\n" );
        }
        else
        {
            log( "Metric Discovery failed to initialize.\n" );
        }
    }

    if( m_pMDHelper )
    {
        // Open the metric stream for time based sampling, if needed.
        if( config().DevicePerfCounterTimeBasedSampling )
        {
            uint32_t    timerNS =
                config().DevicePerfCounterTimeBasedSamplingPeriod * 1000;
            uint32_t    bufferSizeBytes =
                config().DevicePerfCounterTimeBasedBufferSize;
            m_pMDHelper->OpenStream(
                timerNS,        // timer period, in nanoseconds
                bufferSizeBytes,// buffer size in bytes, 0 = device maximum
                0 );            // pid -> sample all processes
        }

        // Get the dump directory name and create the dump file for
        // metrics, if we haven't created it already.
        if ( !m_MetricDump.is_open() )
        {
            std::string fileName = "";
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
            fileName += '/';
            fileName += sc_PerfCountersFileNamePrefix;
            fileName += "_";
            fileName += metricSetSymbolName;
            fileName += ".csv";

            OS().MakeDumpDirectories( fileName );
            if( m_Config.UniqueFiles )
            {
                fileName = Utils::GetUniqueFileName(fileName);
            }

            m_MetricDump.open( fileName.c_str(), std::ios::out | std::ios::binary );

            m_pMDHelper->PrintMetricNames( m_MetricDump );
            m_pMDHelper->PrintMetricUnits( m_MetricDump );
        }
    }
}